

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test.cpp
# Opt level: O0

int main(void)

{
  _Setw _Var1;
  ostream *poVar2;
  char *m;
  test *t;
  test *__end1;
  test *__begin1;
  test (*__range1) [38];
  undefined1 auStack_278 [4];
  int failures;
  test tests [38];
  
  memcpy(auStack_278,&PTR_anon_var_dwarf_c6a2_0012da80,0x260);
  for (__end1 = (test *)auStack_278; __end1 != (test *)&tests[0x25].test_func; __end1 = __end1 + 1)
  {
    _Var1 = std::setw(0x3c);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
    poVar2 = std::operator<<(poVar2,__end1->name);
    std::operator<<(poVar2,' ');
    (*__end1->test_func)();
    std::operator<<((ostream *)&std::cout,"pass\n");
  }
  puts("\ncool!");
  return 0;
}

Assistant:

int main()
{
  struct test {
    const char* name;
    void (*test_func)();
  };
  test tests[] = {
    {
        "== any_of",
        []{
            REQUIRE(zero == any_of(0,1,2));
            REQUIRE(zero == any_of(1,0,3));
            REQUIRE(zero == any_of(1,2,0));
            REQUIRE(!(zero == any_of(1,2,3)));
            REQUIRE(any_of(0,2,3) == zero);
            REQUIRE(any_of(1,0,3) == zero);
            REQUIRE(any_of(1,2,0) == zero);
            REQUIRE(!(any_of(1,2,3) == zero));
        }
    },
    {
        "== all_of",
        []{
            REQUIRE(!(zero == all_of(1,2,3)));
            REQUIRE(!(zero == all_of(0,1,2)));
            REQUIRE(!(zero == all_of(0,1,0)));
            REQUIRE(zero == all_of(0,0,0));
            REQUIRE(zero == all_of(0,0));
            REQUIRE(zero == all_of(0));
            REQUIRE(!(all_of(1,2,3) == zero));
            REQUIRE(!(all_of(0,1,2) == zero));
            REQUIRE(!(all_of(0,1,0) == zero));
            REQUIRE(all_of(0,0,0) == zero);
            REQUIRE(all_of(0,0) == zero);
            REQUIRE(all_of(0) == zero);
        }
    },
    {
      "== none_of",
      []{
          REQUIRE(zero == none_of(1,2,3));
          REQUIRE(zero == none_of(1,2));
          REQUIRE(zero == none_of(1));
          REQUIRE(!(zero == none_of(0,1,2)));
          REQUIRE(!(zero == none_of(1,2,0)));
          REQUIRE(!(zero == none_of(1,0,2)));
          REQUIRE(!(zero == none_of(0,1)));
          REQUIRE(!(zero == none_of(1,0)));
          REQUIRE(!(zero == none_of(0)));
          REQUIRE(zero == none_of(1));
      }
    },
    {
      "!= any_of",
      []{
          REQUIRE(zero != any_of(1,2,3));
          REQUIRE(!(zero != any_of(0,1,2)));
          REQUIRE(!(zero != any_of(1,2,0)));
          REQUIRE(!(zero != any_of(1,0,2)));
          REQUIRE(!(zero != any_of(0,1)));
          REQUIRE(!(zero != any_of(1,0)));
          REQUIRE(!(zero != any_of(0)));
          REQUIRE(zero != any_of(1));
          REQUIRE(any_of(1,2,3) != zero);
          REQUIRE(!(any_of(0,1,2) != zero));
          REQUIRE(!(any_of(1,2,0) != zero));
          REQUIRE(!(any_of(1,0,2) != zero));
          REQUIRE(!(any_of(0,1) != zero));
          REQUIRE(!(any_of(1,0) != zero));
          REQUIRE(!(any_of(0) != zero));
          REQUIRE(any_of(1) != zero);
      }
    },
    {
        "!= all_of",
        [] {
            REQUIRE(zero != all_of(1, 2, 3));
            REQUIRE(zero != all_of(0,1,2));
            REQUIRE(zero != all_of(1,0,2));
            REQUIRE(zero != all_of(1,2,0));
            REQUIRE(zero != all_of(1,2));
            REQUIRE(zero != all_of(0,1));
            REQUIRE(zero != all_of(1,0));
            REQUIRE(zero != all_of(1));
            REQUIRE(!(zero != all_of(0)));
            REQUIRE(!(zero != all_of(0,0)));
            REQUIRE(!(zero != all_of(0,0,0)));
            REQUIRE(all_of(1, 2, 3) != zero);
            REQUIRE(all_of(0,1,2) != zero);
            REQUIRE(all_of(1,0,2) != zero);
            REQUIRE(all_of(1,2,0) != zero);
            REQUIRE(all_of(1,2) != zero);
            REQUIRE(all_of(0,1) != zero);
            REQUIRE(all_of(1,0) != zero);
            REQUIRE(all_of(1) != zero);
            REQUIRE(!(all_of(0) != zero));
            REQUIRE(!(all_of(0,0) != zero));
            REQUIRE(!(all_of(0,0,0) != zero));
        }
    },
    {
        "!= none_of",
        []{
            REQUIRE(!(zero != none_of(1,2,3)));
            REQUIRE(zero != none_of(0,1,2));
            REQUIRE(zero != none_of(1,0,2));
            REQUIRE(zero != none_of(1,2,0));
            REQUIRE(!(zero != none_of(1,2)));
            REQUIRE(zero != none_of(0,1));
            REQUIRE(zero != none_of(1,0));
            REQUIRE(zero != none_of(0));
            REQUIRE(!(zero != none_of(1)));
            REQUIRE(!(none_of(1,2,3) != zero));
            REQUIRE(none_of(0,1,2) != zero);
            REQUIRE(none_of(1,0,2) != zero);
            REQUIRE(none_of(1,2,0) != zero);
            REQUIRE(!(none_of(1,2) != zero));
            REQUIRE(none_of(0,1) != zero);
            REQUIRE(none_of(1,0) != zero);
            REQUIRE(none_of(0) != zero);
            REQUIRE(!(none_of(1) != zero));
        }
    },
    {
        "< any_of",
        []{
            REQUIRE(zero < any_of(0,0,1));
            REQUIRE(zero < any_of(0,1,0));
            REQUIRE(zero < any_of(1,0,0));
            REQUIRE(!(zero < any_of(0,0,0)));
            REQUIRE(zero < any_of(0,1));
            REQUIRE(zero < any_of(1,0));
            REQUIRE(!(zero < any_of(0,0)));
            REQUIRE(zero < any_of(1));
            REQUIRE(!(zero < any_of(0)));
            REQUIRE(any_of(0,0,1) > zero);
            REQUIRE(any_of(0,1,0) > zero);
            REQUIRE(any_of(1,0,0) > zero);
            REQUIRE(!(any_of(0,0,0) > zero));
            REQUIRE(any_of(0,1) > zero);
            REQUIRE(any_of(1,0) > zero);
            REQUIRE(!(any_of(0,0) > zero));
            REQUIRE(any_of(1) > zero);
            REQUIRE(!(any_of(0) > zero));
        }
    },
    {
        "< all_of",
        []{
            REQUIRE(zero < all_of(1,2,3));
            REQUIRE(!(zero < all_of(0,1,2)));
            REQUIRE(!(zero < all_of(1,0,2)));
            REQUIRE(!(zero < all_of(1,2,0)));
            REQUIRE(zero < all_of(1,2));
            REQUIRE(!(zero < all_of(0,1)));
            REQUIRE(!(zero < all_of(1,0)));
            REQUIRE(zero < all_of(1));
            REQUIRE(!(zero < all_of(0)));
            REQUIRE(all_of(1,2,3) > zero);
            REQUIRE(!(all_of(0,1,2) > zero));
            REQUIRE(!(all_of(1,0,2) > zero));
            REQUIRE(!(all_of(1,2,0) > zero));
            REQUIRE(all_of(1,2) > zero);
            REQUIRE(!(all_of(0,1) > zero));
            REQUIRE(!(all_of(1,0) > zero));
            REQUIRE(all_of(1) > zero);
            REQUIRE(!(all_of(0) > zero));
        }
    },
    {
      "< none_of",
      []{
          REQUIRE(zero < none_of(0,0,0));
          REQUIRE(!(zero < none_of(1,0,0)));
          REQUIRE(!(zero < none_of(0,1,0)));
          REQUIRE(!(zero < none_of(0,0,1)));
          REQUIRE(zero < none_of(0,0));
          REQUIRE(!(zero < none_of(1,0)));
          REQUIRE(!(zero < none_of(0,1)));
          REQUIRE(zero < none_of(0));
          REQUIRE(!(zero < none_of(1)));
          REQUIRE(none_of(0,0,0) > zero);
          REQUIRE(!(none_of(1,0,0) > zero));
          REQUIRE(!(none_of(0,1,0) > zero));
          REQUIRE(!(none_of(0,0,1) > zero));
          REQUIRE(none_of(0,0) > zero);
          REQUIRE(!(none_of(1,0) > zero));
          REQUIRE(!(none_of(0,1) > zero));
          REQUIRE(none_of(0) > zero);
          REQUIRE(!(none_of(1) > zero));
      }
    },
    {
        "<= any_of",
        []{
            REQUIRE(!(zero <= any_of(-1,-1,-1)));
            REQUIRE(zero <= any_of(0,-1,-1));
            REQUIRE(zero <= any_of(-1,0,-1));
            REQUIRE(zero <= any_of(-1,-1,0));
            REQUIRE(zero <= any_of(0,-1));
            REQUIRE(zero <= any_of(-1,0));
            REQUIRE(!(zero <= any_of(-1,-1)));
            REQUIRE(zero <= any_of(0));
            REQUIRE(!(zero <= any_of(-1)));
            REQUIRE(!(any_of(-1,-1,-1) >= zero));
            REQUIRE(any_of(0,-1,-1) >= zero);
            REQUIRE(any_of(-1,0,-1) >= zero);
            REQUIRE(any_of(-1,-1,0) >= zero);
            REQUIRE(any_of(0,-1) >= zero);
            REQUIRE(any_of(-1,0) >= zero);
            REQUIRE(!(any_of(-1,-1) >= zero));
            REQUIRE(any_of(0) >= zero);
            REQUIRE(!(any_of(-1) >= zero));
        }
    },
    {
        "<= all_of",
        []{
            REQUIRE(zero <= all_of(0,0,0));
            REQUIRE(!(zero <= all_of(0,-1,-1)));
            REQUIRE(!(zero <= all_of(-1,0,-1)));
            REQUIRE(!(zero <= all_of(-1,-1,0)));
            REQUIRE(zero <= all_of(0,0));
            REQUIRE(!(zero <= all_of(0,-1)));
            REQUIRE(!(zero <= all_of(-1,0)));
            REQUIRE(zero <= all_of(0));
            REQUIRE(!(zero <= all_of(-1)));
            REQUIRE(all_of(0,0,0) >= zero);
            REQUIRE(!(all_of(0,-1,-1) >= zero));
            REQUIRE(!(all_of(-1,0,-1) >= zero));
            REQUIRE(!(all_of(-1,-1,0) >= zero));
            REQUIRE(all_of(0,0) >= zero);
            REQUIRE(!(all_of(0,-1) >= zero));
            REQUIRE(!(all_of(-1,0) >= zero));
            REQUIRE(all_of(0) >= zero);
            REQUIRE(!(all_of(-1) >= zero));
        }
    },
    {
        "<= none_of",
        []{
            REQUIRE(zero <= none_of(-1,-1,-1));
            REQUIRE(!(zero <= none_of(0,-1,-1)));
            REQUIRE(!(zero <= none_of(-1,0,-1)));
            REQUIRE(!(zero <= none_of(-1,-1,0)));
            REQUIRE(zero <= none_of(-1,-1));
            REQUIRE(!(zero <= none_of(-1,0)));
            REQUIRE(!(zero <= none_of(0,-1)));
            REQUIRE(zero <= none_of(-1));
            REQUIRE(!(zero <= none_of(0)));
            REQUIRE(none_of(-1,-1,-1) >= zero);
            REQUIRE(!(none_of(0,-1,-1) >= zero));
            REQUIRE(!(none_of(-1,0,-1) >= zero));
            REQUIRE(!(none_of(-1,-1,0) >= zero));
            REQUIRE(none_of(-1,-1) >= zero);
            REQUIRE(!(none_of(-1,0) >= zero));
            REQUIRE(!(none_of(0,-1) >= zero));
            REQUIRE(none_of(-1) >= zero);
            REQUIRE(!(none_of(0) >= zero));
        }
    },
    ///
    {
        "> any_of",
        []{
            REQUIRE(zero > any_of(0,0,-1));
            REQUIRE(zero > any_of(0,-1,0));
            REQUIRE(zero > any_of(-1,0,0));
            REQUIRE(!(zero > any_of(0,0,0)));
            REQUIRE(zero > any_of(0,-1));
            REQUIRE(zero > any_of(-1,0));
            REQUIRE(!(zero > any_of(0,0)));
            REQUIRE(zero > any_of(-1));
            REQUIRE(!(zero > any_of(0)));
            REQUIRE(any_of(0,0,-1) < zero);
            REQUIRE(any_of(0,-1,0) < zero);
            REQUIRE(any_of(-1,0,0) < zero);
            REQUIRE(!(any_of(0,0,0) < zero));
            REQUIRE(any_of(0,-1) < zero);
            REQUIRE(any_of(-1,0) < zero);
            REQUIRE(!(any_of(0,0) < zero));
            REQUIRE(any_of(-1) < zero);
            REQUIRE(!(any_of(0) < zero));
        }
    },
    {
        "> all_of",
        []{
            REQUIRE(zero > all_of(-1,-2,-3));
            REQUIRE(!(zero > all_of(0,-1,-2)));
            REQUIRE(!(zero > all_of(-1,0,-2)));
            REQUIRE(!(zero > all_of(-1,-2,0)));
            REQUIRE(zero > all_of(-1,-2));
            REQUIRE(!(zero > all_of(0,-1)));
            REQUIRE(!(zero > all_of(-1,0)));
            REQUIRE(zero > all_of(-1));
            REQUIRE(!(zero > all_of(0)));
            REQUIRE(all_of(-1,-2,-3) < zero);
            REQUIRE(!(all_of(0,-1,-2) < zero));
            REQUIRE(!(all_of(-1,0,-2) < zero));
            REQUIRE(!(all_of(-1,-2,0) < zero));
            REQUIRE(all_of(-1,-2) < zero);
            REQUIRE(!(all_of(0,-1) < zero));
            REQUIRE(!(all_of(-1,0) < zero));
            REQUIRE(all_of(-1) < zero);
            REQUIRE(!(all_of(0) < zero));
        }
    },
    {
        "> none_of",
        []{
            REQUIRE(zero > none_of(0,0,0));
            REQUIRE(!(zero > none_of(-1,0,0)));
            REQUIRE(!(zero > none_of(0,-1,0)));
            REQUIRE(!(zero > none_of(0,0,-1)));
            REQUIRE(zero > none_of(0,0));
            REQUIRE(!(zero > none_of(-1,0)));
            REQUIRE(!(zero > none_of(0,-1)));
            REQUIRE(zero > none_of(0));
            REQUIRE(!(zero > none_of(-1)));
            REQUIRE(none_of(0,0,0) < zero);
            REQUIRE(!(none_of(-1,0,0) < zero));
            REQUIRE(!(none_of(0,-1,0) < zero));
            REQUIRE(!(none_of(0,0,-1) < zero));
            REQUIRE(none_of(0,0) < zero);
            REQUIRE(!(none_of(-1,0) < zero));
            REQUIRE(!(none_of(0,-1) < zero));
            REQUIRE(none_of(0) < zero);
            REQUIRE(!(none_of(-1) < zero));
        }
    },
    {
        ">= any_of",
        []{
            REQUIRE(!(zero >= any_of(1,1,1)));
            REQUIRE(zero >= any_of(0,1,1));
            REQUIRE(zero >= any_of(1,0,1));
            REQUIRE(zero >= any_of(1,1,0));
            REQUIRE(zero >= any_of(0,1));
            REQUIRE(zero >= any_of(1,0));
            REQUIRE(!(zero >= any_of(1,1)));
            REQUIRE(zero >= any_of(0));
            REQUIRE(!(zero >= any_of(1)));
            REQUIRE(!(any_of(1,1,1) <= zero));
            REQUIRE(any_of(0,1,1) <= zero);
            REQUIRE(any_of(1,0,1) <= zero);
            REQUIRE(any_of(1,1,0) <= zero);
            REQUIRE(any_of(0,1) <= zero);
            REQUIRE(any_of(1,0) <= zero);
            REQUIRE(!(any_of(1,1) <= zero));
            REQUIRE(any_of(0) <= zero);
            REQUIRE(!(any_of(1) <= zero));
        }
    },
    {
        ">= all_of",
        []{
            REQUIRE(zero >= all_of(0,0,0));
            REQUIRE(!(zero >= all_of(0,1,1)));
            REQUIRE(!(zero >= all_of(1,0,1)));
            REQUIRE(!(zero >= all_of(1,1,0)));
            REQUIRE(zero >= all_of(0,0));
            REQUIRE(!(zero >= all_of(0,1)));
            REQUIRE(!(zero >= all_of(1,0)));
            REQUIRE(zero >= all_of(0));
            REQUIRE(!(zero >= all_of(1)));
            REQUIRE(all_of(0,0,0) <= zero);
            REQUIRE(!(all_of(0,1,1) <= zero));
            REQUIRE(!(all_of(1,0,1) <= zero));
            REQUIRE(!(all_of(1,1,0) <= zero));
            REQUIRE(all_of(0,0) <= zero);
            REQUIRE(!(all_of(0,1) <= zero));
            REQUIRE(!(all_of(1,0) <= zero));
            REQUIRE(all_of(0) <= zero);
            REQUIRE(!(all_of(1) <= zero));
        }
    },
    {
        ">= none_of",
        []{
            REQUIRE(zero >= none_of(1,1,1));
            REQUIRE(!(zero >= none_of(0,1,1)));
            REQUIRE(!(zero >= none_of(1,0,1)));
            REQUIRE(!(zero >= none_of(1,1,0)));
            REQUIRE(zero >= none_of(1,1));
            REQUIRE(!(zero >= none_of(1,0)));
            REQUIRE(!(zero >= none_of(0,1)));
            REQUIRE(zero >= none_of(1));
            REQUIRE(!(zero >= none_of(0)));
            REQUIRE(none_of(1,1,1) <= zero);
            REQUIRE(!(none_of(0,1,1) <= zero));
            REQUIRE(!(none_of(1,0,1) <= zero));
            REQUIRE(!(none_of(1,1,0) <= zero));
            REQUIRE(none_of(1,1) <= zero);
            REQUIRE(!(none_of(1,0) <= zero));
            REQUIRE(!(none_of(0,1) <= zero));
            REQUIRE(none_of(1) <= zero);
            REQUIRE(!(none_of(0) <= zero));
        }
    },
    {
        "any_of(...)",
        []{
            REQUIRE(any_of(negate, next)(1) < 0);
            REQUIRE(!(any_of(negate, next)(zero) < 0));
        }
    },
    {
        "all_of(...)",
        []{
            REQUIRE(all_of(negate, next)(zero) >= 0);
            REQUIRE(all_of(negate, next)(-1) >= 0);
        }
    },
    {
        "none_of(...)",
        []{
            REQUIRE(none_of(negate, next)(zero) < 0);
            REQUIRE(none_of(negate, next)(-1) < 0);
        }
    },
    {
      "print any_of",
      []{
        std::ostringstream os;
        os << any_of{1,3,5};
        auto s = os.str();
        REQUIRE(s == "any_of{1,3,5}");
      }
    },
    {
      "print none_of",
      []{
        std::ostringstream os;
        os << none_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "none_of{1,2,3}");
      }
    },
    {
      "print all_of",
      []{
        std::ostringstream os;
        os << all_of{1,2,3};
        auto s = os.str();
        REQUIRE(s == "all_of{1,2,3}");
      }
    },
    {
      "all_of is true if all members are true",
      []{
        int v;
        auto b = bool(all_of{true, 1, &v});
        REQUIRE(b);
      }
    },
    {
      "all_of is false with nullptr",
      []{
        auto b = bool(all_of{true, 1, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "all_of is false with int(0)",
      [] {
        int v = 0;
        auto b = bool(all_of{true, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "all_of isfalse with false member",
      [] {
        int v = 1;
        auto b = bool(all_of(false, v, &v));
        REQUIRE(!b);
      }
    },
    {
      "none_of is true if all members are false",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "none_of is false if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(none_of{false, v, &v});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(none_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "none_of is false if a member true",
      []{
        int v = 0;
        auto b = bool(none_of{true, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is false all members are false",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(!b);
      }
    },
    {
      "any_of is true if a member is a non-nullptr",
      []{
        int v = 0;
        auto b = bool(any_of{false, v, &v});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is a non-zero int",
      []{
        int v = 1;
        auto b = bool(any_of{false, v, nullstr});
        REQUIRE(b);
      }
    },
    {
      "any_of is true if a member is true",
      []{
        int v = 0;
        auto b = bool(any_of{true, v, nullstr});
        REQUIRE(b);
      }
    },
    {
        "binding an lvalue reference keeps a reference",
        []{
            auto p = std::make_shared<int>(3);
            auto cond = all_of{[](auto&& v) -> bool{ return v.get();}}(p);
            REQUIRE(p.use_count() == 1U);
            REQUIRE(cond);
        }
    },
    {
        "binding an rvalue reference copies an instance",
        []{
            auto cond = all_of{[](auto&& v) { return v.use_count() == 1;}}(std::make_shared<int>(3));
            REQUIRE(cond);
        }

    }

  };
  int failures = 0;
  for (auto& t : tests)
  {
    try {
      std::cout << std::setw(60) << std::left << t.name << ' ';
      t.test_func();
      std::cout << "pass\n";
    }
    catch (const char* m)
    {
      ++failures;
      std::cout << "failed: " << m << '\n';
    }
  }
  if (!failures)
  {
    std::puts("\ncool!");
  }
  else
  {
    std::puts("\nbummer!");
  }
  return failures;
}